

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::checkResults
          (ViewportIndexSubroutine *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  byte bVar1;
  bool bVar2;
  GLint expected_value;
  reference pvVar3;
  uint local_68;
  uint uStack_64;
  bool result_1;
  GLuint x_1;
  GLuint y_1;
  uint uStack_58;
  bool result;
  GLuint x;
  GLuint y;
  GLint expected_right;
  GLint expected_left;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> texture_data;
  bool check_result;
  GLuint draw_call_index_local;
  texture *param_2_local;
  texture *texture_0_local;
  ViewportIndexSubroutine *this_local;
  
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 1;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = draw_call_index;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_40,0x4000);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  Utils::texture::get(texture_0,0x8d94,0x1404,pvVar3);
  expected_value = -1;
  if (texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 1) {
    expected_value = 5;
  }
  uStack_58 = 0;
  do {
    if (3 < uStack_58) {
      for (uStack_64 = 0; uStack_64 < 4; uStack_64 = uStack_64 + 1) {
        for (local_68 = 2; local_68 < 4; local_68 = local_68 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_40,0);
          bVar2 = DrawTestBase::checkRegionR32I
                            (&this->super_DrawTestBase,local_68,uStack_64,expected_value,pvVar3);
          if (!bVar2) {
            texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
            goto LAB_016fdbd7;
          }
        }
      }
LAB_016fdbd7:
      bVar1 = texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._3_1_;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40)
      ;
      return (bool)(bVar1 & 1);
    }
    for (y_1 = 0; y_1 < 2; y_1 = y_1 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,0);
      bVar2 = DrawTestBase::checkRegionR32I(&this->super_DrawTestBase,y_1,uStack_58,4,pvVar3);
      if (!bVar2) {
        texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._3_1_ = 0;
        goto LAB_016fdbd7;
      }
    }
    uStack_58 = uStack_58 + 1;
  } while( true );
}

Assistant:

bool ViewportIndexSubroutine::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										   GLuint		   draw_call_index)
{
	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* Left is 4 and right is -1, or left is 4 and right is 5 */
	GLint expected_left  = 4;
	GLint expected_right = (1 == draw_call_index) ? 5 : -1;

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_left, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 2; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_right, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

end:
	return check_result;
}